

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O1

bool __thiscall mkvmuxer::Cluster::QueueOrWriteFrame(Cluster *this,Frame *frame)

{
  map<unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>_>
  *this_00;
  size_t *psVar1;
  uint64_t uVar2;
  bool bVar3;
  int iVar4;
  Frame *pFVar5;
  mapped_type *pmVar6;
  _List_node_base *p_Var7;
  _Rb_tree_node_base *p_Var8;
  _List_iterator<mkvmuxer::Frame_*> *p_Var9;
  _Node_alloc_type *__alloc;
  iterator current_track_iterator;
  uint64_t track_number;
  vector<std::_List_iterator<mkvmuxer::Frame_*>,_std::allocator<std::_List_iterator<mkvmuxer::Frame_*>_>_>
  frames_to_erase;
  _List_iterator<mkvmuxer::Frame_*> local_58;
  uint64_t local_50;
  _List_iterator<mkvmuxer::Frame_*> *local_48;
  iterator iStack_40;
  _List_iterator<mkvmuxer::Frame_*> *local_38;
  
  if ((frame == (Frame *)0x0) || (bVar3 = Frame::IsValid(frame), !bVar3)) {
    bVar3 = false;
  }
  else {
    if (this->write_last_frame_with_duration_ == false) {
      bVar3 = DoWriteFrame(this,frame);
      return bVar3;
    }
    local_50 = frame->track_number_;
    pFVar5 = (Frame *)operator_new(0x68);
    pFVar5->frame_ = (uint8_t *)0x0;
    pFVar5->is_key_ = false;
    pFVar5->add_id_ = 0;
    pFVar5->additional_ = (uint8_t *)0x0;
    pFVar5->additional_length_ = 0;
    pFVar5->duration_ = 0;
    pFVar5->duration_set_ = false;
    pFVar5->length_ = 0;
    pFVar5->track_number_ = 0;
    pFVar5->timestamp_ = 0;
    pFVar5->discard_padding_ = 0;
    *(undefined8 *)((long)&pFVar5->discard_padding_ + 1) = 0;
    *(undefined8 *)((long)&pFVar5->reference_block_timestamp_ + 1) = 0;
    Frame::CopyFrom(pFVar5,frame);
    this_00 = &this->stored_frames_;
    pmVar6 = std::
             map<unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>_>
             ::operator[](this_00,&local_50);
    p_Var7 = (_List_node_base *)operator_new(0x18);
    p_Var7[1]._M_next = (_List_node_base *)pFVar5;
    std::__detail::_List_node_base::_M_hook(p_Var7);
    psVar1 = &(pmVar6->super__List_base<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>).
              _M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    local_38 = (_List_iterator<mkvmuxer::Frame_*> *)0x0;
    local_48 = (_List_iterator<mkvmuxer::Frame_*> *)0x0;
    iStack_40._M_current = (_List_iterator<mkvmuxer::Frame_*> *)0x0;
    pmVar6 = std::
             map<unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>_>
             ::operator[](this_00,&local_50);
    local_58._M_node =
         (pmVar6->super__List_base<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>)._M_impl.
         _M_node.super__List_node_base._M_next;
    pmVar6 = std::
             map<unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>_>
             ::operator[](this_00,&local_50);
    p_Var7 = (pmVar6->super__List_base<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>).
             _M_impl._M_node.super__List_node_base._M_prev;
    if (local_58._M_node == p_Var7) {
      bVar3 = true;
    }
    else {
      do {
        uVar2 = local_50;
        pFVar5 = (Frame *)local_58._M_node[1]._M_next;
        for (p_Var8 = (this->stored_frames_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var8 != &(this->stored_frames_)._M_t._M_impl.super__Rb_tree_header;
            p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
          if ((*(uint64_t *)(p_Var8 + 1) != uVar2) &&
             ((p_Var8[1]._M_parent)->_M_left[2]._M_parent < (_Base_ptr)pFVar5->timestamp_)) {
            iVar4 = 2;
            goto LAB_0011c365;
          }
        }
        bVar3 = DoWriteFrame(this,pFVar5);
        if (pFVar5 != (Frame *)0x0) {
          Frame::~Frame(pFVar5);
          operator_delete(pFVar5);
        }
        if (bVar3) {
          if (iStack_40._M_current == local_38) {
            std::
            vector<std::_List_iterator<mkvmuxer::Frame*>,std::allocator<std::_List_iterator<mkvmuxer::Frame*>>>
            ::_M_realloc_insert<std::_List_iterator<mkvmuxer::Frame*>const&>
                      ((vector<std::_List_iterator<mkvmuxer::Frame*>,std::allocator<std::_List_iterator<mkvmuxer::Frame*>>>
                        *)&local_48,iStack_40,&local_58);
          }
          else {
            (iStack_40._M_current)->_M_node = local_58._M_node;
            iStack_40._M_current = iStack_40._M_current + 1;
          }
          iVar4 = 0;
          bVar3 = true;
        }
        else {
          iVar4 = 1;
LAB_0011c365:
          bVar3 = false;
        }
        if (!bVar3) goto LAB_0011c397;
        local_58._M_node = (local_58._M_node)->_M_next;
      } while (local_58._M_node != p_Var7);
      iVar4 = 2;
LAB_0011c397:
      bVar3 = iVar4 == 2;
    }
    if ((bVar3 != false) && (local_48 != iStack_40._M_current)) {
      p_Var9 = local_48;
      do {
        pmVar6 = std::
                 map<unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>_>
                 ::operator[](this_00,&local_50);
        p_Var7 = p_Var9->_M_node;
        psVar1 = &(pmVar6->super__List_base<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>).
                  _M_impl._M_node._M_size;
        *psVar1 = *psVar1 - 1;
        std::__detail::_List_node_base::_M_unhook();
        operator_delete(p_Var7);
        p_Var9 = p_Var9 + 1;
      } while (p_Var9 != iStack_40._M_current);
    }
    if (local_48 != (_List_iterator<mkvmuxer::Frame_*> *)0x0) {
      operator_delete(local_48);
    }
  }
  return bVar3;
}

Assistant:

bool Cluster::QueueOrWriteFrame(const Frame* const frame) {
  if (!frame || !frame->IsValid())
    return false;

  // If |write_last_frame_with_duration_| is not set, then write the frame right
  // away.
  if (!write_last_frame_with_duration_) {
    return DoWriteFrame(frame);
  }

  // Queue the current frame.
  uint64_t track_number = frame->track_number();
  Frame* const frame_to_store = new Frame();
  frame_to_store->CopyFrom(*frame);
  stored_frames_[track_number].push_back(frame_to_store);

  // Iterate through all queued frames in the current track except the last one
  // and write it if it is okay to do so (i.e.) no other track has an held back
  // frame with timestamp <= the timestamp of the frame in question.
  std::vector<std::list<Frame*>::iterator> frames_to_erase;
  for (std::list<Frame*>::iterator
           current_track_iterator = stored_frames_[track_number].begin(),
           end = --stored_frames_[track_number].end();
       current_track_iterator != end; ++current_track_iterator) {
    const Frame* const frame_to_write = *current_track_iterator;
    bool okay_to_write = true;
    for (FrameMapIterator track_iterator = stored_frames_.begin();
         track_iterator != stored_frames_.end(); ++track_iterator) {
      if (track_iterator->first == track_number) {
        continue;
      }
      if (track_iterator->second.front()->timestamp() <
          frame_to_write->timestamp()) {
        okay_to_write = false;
        break;
      }
    }
    if (okay_to_write) {
      const bool wrote_frame = DoWriteFrame(frame_to_write);
      delete frame_to_write;
      if (!wrote_frame)
        return false;
      frames_to_erase.push_back(current_track_iterator);
    } else {
      break;
    }
  }
  for (std::vector<std::list<Frame*>::iterator>::iterator iterator =
           frames_to_erase.begin();
       iterator != frames_to_erase.end(); ++iterator) {
    stored_frames_[track_number].erase(*iterator);
  }
  return true;
}